

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void read_frm_crc(FILE *fp,FrmCrc *crc)

{
  uint uVar1;
  uint uVar2;
  uint local_20;
  uint local_1c;
  RK_S32 ret;
  RK_U32 loop;
  FrmCrc *crc_local;
  FILE *fp_local;
  
  if (fp != (FILE *)0x0) {
    local_20 = __isoc99_fscanf(fp,"%d",crc);
    for (local_1c = 0; local_1c < (crc->luma).sum_cnt; local_1c = local_1c + 1) {
      uVar1 = __isoc99_fscanf(fp,"%lx",(crc->luma).sum + local_1c);
      local_20 = uVar1 | local_20;
    }
    uVar1 = __isoc99_fscanf(fp,"%08x",&(crc->luma).vor);
    uVar2 = __isoc99_fscanf(fp,"%d",&crc->chroma);
    local_20 = uVar2 | uVar1 | local_20;
    for (local_1c = 0; local_1c < (crc->chroma).sum_cnt; local_1c = local_1c + 1) {
      uVar1 = __isoc99_fscanf(fp,"%lx",(crc->chroma).sum + local_1c);
      local_20 = uVar1 | local_20;
    }
    uVar1 = __isoc99_fscanf(fp,"%08x",&(crc->chroma).vor);
    if ((uVar1 | local_20) == 0xffffffff) {
      _mpp_log_l(2,"utils","unexpected EOF found\n","read_frm_crc");
    }
  }
  return;
}

Assistant:

void read_frm_crc(FILE *fp, FrmCrc *crc)
{
    RK_U32 loop = 0;

    if (fp) {
        RK_S32 ret = 0;
        // luma
        ret = fscanf(fp, "%d", &crc->luma.len);
        for (loop = 0; loop < crc->luma.sum_cnt; loop++) {
            ret |= fscanf(fp, "%lx", &crc->luma.sum[loop]);
        }
        ret |= fscanf(fp, "%08x", &crc->luma.vor);

        // chroma
        ret |= fscanf(fp, "%d", &crc->chroma.len);
        for (loop = 0; loop < crc->chroma.sum_cnt; loop++) {
            ret |= fscanf(fp, "%lx", &crc->chroma.sum[loop]);
        }
        ret |= fscanf(fp, "%08x", &crc->chroma.vor);
        if (ret == EOF)
            mpp_err_f("unexpected EOF found\n");
    }
}